

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

int cmExecuteCommand(void *arg,char *name,int numArgs,char **args)

{
  cmMakefile *makefile;
  ulong uVar1;
  bool bVar2;
  cmListFileFunction lff;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> lffArgs;
  cmExecutionStatus status;
  cmListFileFunction local_118;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_108;
  cmMakefile *local_f0;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_e8;
  string local_c8;
  cmExecutionStatus local_a8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  local_108.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0 = (cmMakefile *)arg;
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::reserve
            (&local_108,(long)numArgs);
  uVar1 = 0;
  if (0 < numArgs) {
    uVar1 = (ulong)(uint)numArgs;
  }
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    local_a8.Makefile._0_4_ = 1;
    local_118.Impl.
    super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
    _0_4_ = 0;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&local_108,args,
               (Delimiter *)&local_a8,(int *)&local_118);
    args = args + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,name,(allocator<char> *)&local_a8);
  local_e8.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_108.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_e8.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_108.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_e8.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_108.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_108.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmListFileFunction::cmListFileFunction(&local_118,&local_c8,0,0,&local_e8);
  makefile = local_f0;
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  cmExecutionStatus::cmExecutionStatus(&local_a8,makefile);
  local_58._M_engaged = false;
  bVar2 = cmMakefile::ExecuteCommand
                    (makefile,&local_118,&local_a8,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_58);
  cmExecutionStatus::~cmExecutionStatus(&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.Impl.
              super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_108);
  return (uint)bVar2;
}

Assistant:

static int CCONV cmExecuteCommand(void* arg, const char* name, int numArgs,
                                  const char** args)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);

  std::vector<cmListFileArgument> lffArgs;
  lffArgs.reserve(numArgs);
  for (int i = 0; i < numArgs; ++i) {
    // Assume all arguments are quoted.
    lffArgs.emplace_back(args[i], cmListFileArgument::Quoted, 0);
  }

  cmListFileFunction lff{ name, 0, 0, std::move(lffArgs) };
  cmExecutionStatus status(*mf);
  return mf->ExecuteCommand(lff, status);
}